

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

int __thiscall avilib::AviReader::open(AviReader *this,char *__file,int __oflag,...)

{
  LoggingObject *this_00;
  ifstream *piVar1;
  AVISTREAMHEADER *pAVar2;
  FOURCC *__s;
  uint32_t *puVar3;
  WORD WVar4;
  uint uVar5;
  _Elt_pointer puVar6;
  undefined8 *puVar7;
  uint uVar8;
  uint uVar9;
  _Ios_Seekdir _Var10;
  char *__nptr;
  _Map_pointer pp_Var11;
  _Elt_pointer p_Var12;
  char cVar13;
  char cVar14;
  int iVar15;
  int iVar16;
  undefined8 uVar17;
  long *plVar18;
  size_t sVar19;
  int *piVar20;
  uint *puVar21;
  void *pvVar22;
  deque<avilib::AviReader::_dmlindex,std::allocator<avilib::AviReader::_dmlindex>> *pdVar23;
  mapped_type *pmVar24;
  ulong uVar25;
  ulong uVar26;
  char cVar27;
  uint uVar28;
  iterator *piVar29;
  _Elt_pointer p_Var30;
  AVIOLDINDEX *idx;
  int *__s_00;
  _Elt_pointer p_Var31;
  long lVar32;
  bool bVar33;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  uint32_t size;
  char tag [5];
  deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_> entries;
  _Map_pointer local_3b8;
  AVISUPERINDEX_ENTRY entry;
  uint local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  ulong local_388;
  ulong local_380;
  uint local_378;
  int32_t stream_idx;
  DMLINDEX dml_index;
  string fcc;
  AVISUPERINDEX super_index;
  array<unsigned_int,_6UL> allowed;
  uint local_240 [2];
  char message [512];
  
  tag[0] = '\0';
  tag[1] = '\0';
  tag[2] = '\0';
  tag[3] = '\0';
  tag[4] = '\0';
  size = 0;
  this->m_useMovieOffset = false;
  this_00 = &this->super_LoggingObject;
  LoggingObject::clear_log(this_00);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_moviOffs);
  piVar1 = &this->_f;
  std::ifstream::open((char *)piVar1,(_Ios_Openmode)__file);
  if (*(int *)(&this->field_0x78 + *(long *)(*(long *)&this->_f + -0x18)) == 0) {
    std::istream::seekg((long)piVar1,_S_beg);
    iVar15 = (int)piVar1;
    if (*(int *)(&this->field_0x78 + *(long *)(*(long *)&this->_f + -0x18)) == 0) {
      bVar33 = false;
      local_378 = 0;
      do {
        piVar29 = &entries.
                   super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                   ._M_impl.super__Deque_impl_data._M_start;
        uVar17 = std::istream::tellg();
        plVar18 = (long *)std::istream::read((char *)piVar1,(long)tag);
        if ((*(byte *)((long)plVar18 + *(long *)(*plVar18 + -0x18) + 0x20) & 5) != 0) break;
        snprintf(message,0x200,"%s @ %llu",tag,uVar17);
        entries.
        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
        ._M_impl.super__Deque_impl_data._M_map = &piVar29->_M_cur;
        sVar19 = strlen(message);
        std::__cxx11::string::_M_construct<char_const*>((string *)&entries,message,message + sVar19)
        ;
        LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        if ((iterator *)
            entries.
            super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
            ._M_impl.super__Deque_impl_data._M_map != piVar29) {
          operator_delete(entries.
                          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                          ._M_impl.super__Deque_impl_data._M_map,
                          (ulong)((long)&(entries.
                                          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                          ._M_impl.super__Deque_impl_data._M_start._M_cur)->qwOffset
                                 + 1));
        }
        uVar28 = local_378;
        if ((int)tag._0_4_ < 0x686c6d64) {
          if ((int)tag._0_4_ < 0x54465349) {
            if ((int)tag._0_4_ < 0x46464952) {
              if (tag._0_4_ != 0x20495641) {
                if (tag._0_4_ != 0x31786469) goto LAB_0012846a;
                std::istream::read((char *)piVar1,(long)&size);
                piVar20 = (int *)operator_new__((ulong)size);
                lVar32 = std::istream::read((char *)piVar1,(long)piVar20);
                uVar28 = *(uint *)(lVar32 + 8);
                size = uVar28;
                if (uVar28 < 0x10) {
                  uVar25 = (ulong)(uVar28 >> 4);
                }
                else {
                  uVar26 = 0;
                  __s_00 = piVar20;
                  do {
                    if (*__s_00 != 0x20636572) {
                      fcc._M_dataplus._M_p._4_4_ = __s_00[1];
                      fcc._M_dataplus._M_p._0_4_ = *__s_00;
                      fcc._M_string_length = (size_type)(uint)__s_00[2];
                      fcc.field_2._M_allocated_capacity._0_4_ = __s_00[3];
                      entries.
                      super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                      ._M_impl.super__Deque_impl_data._M_map =
                           &entries.
                            super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur;
                      sVar19 = strlen((char *)__s_00);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&entries,__s_00,sVar19 + (long)__s_00);
                      std::__cxx11::string::substr((ulong)&super_index,(ulong)&entries);
                      __nptr = (char *)CONCAT44(super_index.cb,super_index.fcc._);
                      iVar16 = atoi(__nptr);
                      if ((FOURCC *)__nptr != &super_index.dwChunkId) {
                        operator_delete(__nptr,super_index._16_8_ + 1);
                      }
                      entry.qwOffset = CONCAT44(entry.qwOffset._4_4_,iVar16);
                      pdVar23 = (deque<avilib::AviReader::_dmlindex,std::allocator<avilib::AviReader::_dmlindex>>
                                 *)std::
                                   map<int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
                                   ::operator[](&this->m_frameIdxs,(key_type_conflict *)&entry);
                      puVar7 = *(undefined8 **)(pdVar23 + 0x30);
                      if (puVar7 == (undefined8 *)(*(long *)(pdVar23 + 0x40) + -0x18)) {
                        std::
                        deque<avilib::AviReader::_dmlindex,std::allocator<avilib::AviReader::_dmlindex>>
                        ::_M_push_back_aux<avilib::AviReader::_dmlindex_const&>
                                  (pdVar23,(_dmlindex *)&fcc);
                      }
                      else {
                        puVar7[2] = CONCAT44(fcc.field_2._M_allocated_capacity._4_4_,
                                             fcc.field_2._M_allocated_capacity._0_4_);
                        *puVar7 = fcc._M_dataplus._M_p;
                        puVar7[1] = fcc._M_string_length;
                        *(long *)(pdVar23 + 0x30) = *(long *)(pdVar23 + 0x30) + 0x18;
                      }
                      uVar28 = size;
                      if ((iterator *)
                          entries.
                          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                          ._M_impl.super__Deque_impl_data._M_map !=
                          &entries.
                           super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                           ._M_impl.super__Deque_impl_data._M_start) {
                        operator_delete(entries.
                                        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                        ._M_impl.super__Deque_impl_data._M_map,
                                        (ulong)((long)&(entries.
                                                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                                  qwOffset + 1));
                        uVar28 = size;
                      }
                    }
                    __s_00 = __s_00 + 4;
                    uVar26 = uVar26 + 1;
                    uVar25 = (ulong)(uVar28 >> 4);
                  } while (uVar26 < uVar25);
                }
                snprintf(message,0x200,"%x AVIOLDINDEX",uVar25);
                piVar29 = &entries.
                           super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                           ._M_impl.super__Deque_impl_data._M_start;
                entries.
                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                ._M_impl.super__Deque_impl_data._M_map = &piVar29->_M_cur;
                sVar19 = strlen(message);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&entries,message,message + sVar19);
                LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06)
                                  );
                if ((iterator *)
                    entries.
                    super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                    ._M_impl.super__Deque_impl_data._M_map != piVar29) {
                  operator_delete(entries.
                                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                  ._M_impl.super__Deque_impl_data._M_map,
                                  (ulong)((long)&(entries.
                                                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                                 qwOffset + 1));
                }
                operator_delete__(piVar20);
              }
            }
            else if (tag._0_4_ == 0x46464952) {
LAB_00127fab:
              std::istream::read((char *)piVar1,(long)&size);
            }
            else if ((tag._0_4_ == 0x4b4e554a) || (tag._0_4_ != 0x4f464e49)) goto LAB_0012846a;
          }
          else if ((int)tag._0_4_ < 0x58495641) {
            if ((tag._0_4_ != 0x54465349) && (tag._0_4_ == 0x5453494c)) goto LAB_00127fab;
LAB_0012846a:
            std::istream::read((char *)piVar1,(long)&size);
            _Var10 = size;
LAB_0012877d:
            std::istream::seekg((long)piVar1,_Var10);
          }
          else if (tag._0_4_ != 0x58495641) {
            if (tag._0_4_ != 0x66727473) {
              if (tag._0_4_ != 0x68697661) goto LAB_0012846a;
              std::istream::read((char *)piVar1,(long)&size);
              if (size == 0x38) {
                (this->m_avimHeader).fcc = (FOURCC)tag._0_4_;
                (this->m_avimHeader).cb = 0x38;
                std::istream::read((char *)piVar1,(long)&(this->m_avimHeader).dwMicroSecPerFrame);
                snprintf(message,0x200,
                         "AVIMAINHEADER (\n  dwFlags=0x%x,\n  dwWidth=%i,\n  dwHeight=%i,\n  dwStreams=%i,\n  dwInitialFrames=%i,\n  dwMaxBytesPerSec=%i\n  dwMicroSecPerFrame=%i\n  dwPaddingGranularity=%i\n  dwSuggestedBufferSize=%i\n  dwTotalFrames=%i\n)"
                         ,(ulong)(this->m_avimHeader).dwFlags,(ulong)(this->m_avimHeader).dwWidth,
                         (ulong)(this->m_avimHeader).dwHeight,(ulong)(this->m_avimHeader).dwStreams,
                         (ulong)(this->m_avimHeader).dwInitialFrames,
                         (ulong)(this->m_avimHeader).dwMaxBytesPerSec,
                         (ulong)(this->m_avimHeader).dwMicroSecPerFrame,
                         (ulong)(this->m_avimHeader).dwPaddingGranularity,
                         (ulong)(this->m_avimHeader).dwSuggestedBufferSize,
                         (ulong)(this->m_avimHeader).dwTotalFrames);
                entries.
                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                ._M_impl.super__Deque_impl_data._M_map =
                     &entries.
                      super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur;
                sVar19 = strlen(message);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&entries,message,message + sVar19);
                LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02)
                                  );
                goto LAB_001280b4;
              }
              goto LAB_0012785d;
            }
            std::istream::read((char *)piVar1,(long)&size);
            if (bVar33) {
              std::istream::read((char *)piVar1,(long)&this->m_waveformat);
              WVar4 = (this->m_waveformat).wFormatTag;
              if (WVar4 == 0x50) {
                std::istream::seekg((long)piVar1,0xffffffec);
                std::istream::read((char *)piVar1,(long)&this->m_waveformatMpeg12);
                std::istream::seekg((long)piVar1,size - 0x2c);
                local_380 = (ulong)(this->m_waveformatMpeg12).dwHeadBitrate;
                local_388 = (ulong)(this->m_waveformatMpeg12).dwPTSHigh;
                snprintf(message,0x200,
                         "MPEG1WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  dwHeadBitrate=%i,\n  dwPTSHigh=%i,\n  dwPTSLow=%i,\n  fwHeadFlags=%i,\n  fwHeadLayer=%i,\n  fwHeadMode=%i,\n  fwHeadModeExt=%i,\n  wHeadEmphasis%i\n)"
                         ,(ulong)(this->m_waveformat).wFormatTag,
                         (ulong)(this->m_waveformat).nChannels,
                         (ulong)(this->m_waveformat).nAvgBytesPerSec,
                         (ulong)(this->m_waveformat).nSamplesPerSec,
                         (ulong)(this->m_waveformat).wBitsPerSample,
                         (ulong)(this->m_waveformat).nBlockAlign,local_380,local_388,
                         (ulong)(this->m_waveformatMpeg12).dwPTSLow,
                         (ulong)(this->m_waveformatMpeg12).fwHeadFlags,
                         (ulong)(this->m_waveformatMpeg12).fwHeadLayer,
                         (ulong)(this->m_waveformatMpeg12).fwHeadMode,
                         (ulong)(this->m_waveformatMpeg12).fwHeadModeExt,
                         (ulong)(this->m_waveformatMpeg12).wHeadEmphasis);
              }
              else if (WVar4 == 0x55) {
                std::istream::seekg((long)piVar1,0xffffffec);
                std::istream::read((char *)piVar1,(long)&this->m_waveformatMP3);
                std::istream::seekg((long)piVar1,size - 0x24);
                snprintf(message,0x200,
                         "MPEGLAYER3WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n  fdwFlags%i,\n  nBlockSize%i,\n  nCodecDelay%i,\n  nFramesPerBlock%i,\n  wID=%i\n)"
                         ,(ulong)(this->m_waveformat).wFormatTag,
                         (ulong)(this->m_waveformat).nChannels,
                         (ulong)(this->m_waveformat).nAvgBytesPerSec,
                         (ulong)(this->m_waveformat).nSamplesPerSec,
                         (ulong)(this->m_waveformat).wBitsPerSample,
                         (ulong)(this->m_waveformat).nBlockAlign,
                         (ulong)(this->m_waveformatMP3).fdwFlags,
                         (ulong)(this->m_waveformatMP3).nBlockSize,
                         (ulong)(this->m_waveformatMP3).nCodecDelay,
                         (ulong)(this->m_waveformatMP3).nFramesPerBlock,
                         (ulong)(this->m_waveformatMP3).wID);
              }
              else if (WVar4 == 0xfffe) {
                std::istream::seekg((long)piVar1,0xffffffec);
                std::istream::read((char *)piVar1,(long)&this->m_waveformatExt);
                std::istream::seekg((long)piVar1,size - 0x2c);
                snprintf(message,0x200,
                         "WAVEFORMATEXTENSIBLE (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  SubFormat=...,\n  wSamplesPerBlock=%i,\n  dwChannelMask=%i\n)"
                         ,(ulong)(this->m_waveformat).wFormatTag,
                         (ulong)(this->m_waveformat).nChannels,
                         (ulong)(this->m_waveformat).nAvgBytesPerSec,
                         (ulong)(this->m_waveformat).nSamplesPerSec,
                         (ulong)(this->m_waveformat).wBitsPerSample,
                         (ulong)(this->m_waveformat).nBlockAlign,
                         (ulong)(this->m_waveformatExt).Samples.wValidBitsPerSample,
                         (ulong)(this->m_waveformatExt).dwChannelMask);
              }
              else {
                std::istream::seekg((long)piVar1,size - 0x14);
                snprintf(message,0x200,
                         "WAVEFORMATEX (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n)"
                         ,(ulong)(this->m_waveformat).wFormatTag,
                         (ulong)(this->m_waveformat).nChannels,
                         (ulong)(this->m_waveformat).nAvgBytesPerSec,
                         (ulong)(this->m_waveformat).nSamplesPerSec,
                         (ulong)(this->m_waveformat).wBitsPerSample,
                         (ulong)(this->m_waveformat).nBlockAlign);
              }
              piVar29 = &entries.
                         super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                         ._M_impl.super__Deque_impl_data._M_start;
              entries.
              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
              ._M_impl.super__Deque_impl_data._M_map = &piVar29->_M_cur;
              sVar19 = strlen(message);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&entries,message,message + sVar19);
              LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11));
              if ((iterator *)
                  entries.
                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                  ._M_impl.super__Deque_impl_data._M_map != piVar29) {
                operator_delete(entries.
                                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                ._M_impl.super__Deque_impl_data._M_map,
                                (ulong)((long)&(entries.
                                                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                               qwOffset + 1));
              }
              bVar33 = true;
            }
            else {
              std::istream::read((char *)piVar1,(long)&this->m_bitmapInfo);
              if (0x28 < size) {
                std::istream::seekg((long)piVar1,size - 0x28);
              }
              snprintf(message,0x200,
                       "BITMAPINFO (\n  biWidth=%i,\n  biHeight=%i,\n  biPlanes=%i,\n  biBitCount=%i,\n  biCompression=%s,\n  biSizeImage=%i,\n  biXPelsPerMeter=%i,\n  biYPelsPerMeter=%i,\n  biClrUsed=%i,\n  biClrImportant=%i,\n)"
                       ,(ulong)(uint)(this->m_bitmapInfo).biWidth,
                       (ulong)(uint)(this->m_bitmapInfo).biHeight,
                       (ulong)(this->m_bitmapInfo).biPlanes,(ulong)(this->m_bitmapInfo).biBitCount,
                       &(this->m_bitmapInfo).biCompression,(ulong)(this->m_bitmapInfo).biSizeImage,
                       (ulong)(uint)(this->m_bitmapInfo).biXPelsPerMeter,
                       (ulong)(uint)(this->m_bitmapInfo).biYPelsPerMeter,
                       (ulong)(this->m_bitmapInfo).biClrUsed,
                       (ulong)(this->m_bitmapInfo).biClrImportant);
              piVar29 = &entries.
                         super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                         ._M_impl.super__Deque_impl_data._M_start;
              entries.
              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
              ._M_impl.super__Deque_impl_data._M_map = &piVar29->_M_cur;
              sVar19 = strlen(message);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&entries,message,message + sVar19);
              LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
              if ((iterator *)
                  entries.
                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                  ._M_impl.super__Deque_impl_data._M_map != piVar29) {
                operator_delete(entries.
                                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                ._M_impl.super__Deque_impl_data._M_map,
                                (ulong)((long)&(entries.
                                                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                               qwOffset + 1));
              }
              bVar33 = false;
            }
          }
        }
        else if ((int)tag._0_4_ < 0x6c726468) {
          if ((int)tag._0_4_ < 0x69766f6d) {
            if (tag._0_4_ == 0x686c6d64) {
              std::istream::read((char *)piVar1,(long)&size);
              std::istream::read((char *)piVar1,(long)&this->m_odmlExt);
              std::istream::seekg((long)piVar1,size - 4);
              snprintf(message,0x200,"ODMLExtendedAVIHeader ( dwTotalFrames=%i )",
                       (ulong)(this->m_odmlExt).dwTotalFrames);
              entries.
              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
              ._M_impl.super__Deque_impl_data._M_map = &piVar29->_M_cur;
              sVar19 = strlen(message);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&entries,message,message + sVar19);
              LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
LAB_001280b4:
              if ((iterator *)
                  entries.
                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                  ._M_impl.super__Deque_impl_data._M_map !=
                  &entries.
                   super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                   ._M_impl.super__Deque_impl_data._M_start) {
                operator_delete(entries.
                                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                ._M_impl.super__Deque_impl_data._M_map,
                                (ulong)((long)&(entries.
                                                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                               qwOffset + 1));
              }
            }
            else if (tag._0_4_ != 0x68727473) goto LAB_0012846a;
          }
          else {
            if (tag._0_4_ == 0x69766f6d) {
              lVar32 = std::istream::tellg();
              entries.
              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
              ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)(lVar32 - 4);
              puVar6 = (this->m_moviOffs).
                       super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_cur;
              if (puVar6 == (this->m_moviOffs).
                            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                            .super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                _M_push_back_aux<unsigned_long>(&this->m_moviOffs,(unsigned_long *)&entries);
              }
              else {
                *puVar6 = (unsigned_long)
                          entries.
                          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                          ._M_impl.super__Deque_impl_data._M_map;
                (this->m_moviOffs).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur = puVar6 + 1;
              }
LAB_00128776:
              _Var10 = size - 4;
              goto LAB_0012877d;
            }
            if (tag._0_4_ == 0x6c686d64) {
              std::istream::read((char *)piVar1,(long)&size);
              std::istream::seekg((long)piVar1,size);
            }
            else if (tag._0_4_ != 0x6c6d646f) goto LAB_0012846a;
          }
        }
        else if ((int)tag._0_4_ < 0x70727076) {
          if (tag._0_4_ != 0x6c726468) {
            if (tag._0_4_ != 0x6c727473) {
              if (tag._0_4_ != 0x6e727473) goto LAB_0012846a;
              std::istream::read((char *)piVar1,(long)&size);
              goto LAB_00128776;
            }
            if (1 < (int)local_378) goto LAB_0012785d;
            uVar26 = (ulong)local_378;
            pAVar2 = this->m_avisHeader + uVar26;
            std::istream::read((char *)piVar1,(long)pAVar2);
            uVar5 = this->m_avisHeader[uVar26].fccType._;
            bVar33 = uVar5 == 0x73647561;
            if (!bVar33) {
              this->m_videoStreamIdx = uVar28;
            }
            uVar26 = (ulong)(uint)(int)(char)uVar5;
            if ((char)uVar5 == '\0') {
              uVar26 = 0x3f;
            }
            uVar28 = (int)(char)(uVar5 >> 8);
            if ((uVar5 & 0xff00) == 0) {
              uVar28 = 0x3f;
            }
            uVar8 = (int)(char)(uVar5 >> 0x10);
            if ((uVar5 & 0xff0000) == 0) {
              uVar8 = 0x3f;
            }
            uVar9 = (int)uVar5 >> 0x18;
            if (uVar5 < 0x1000000) {
              uVar9 = 0x3f;
            }
            cVar13 = (char)(pAVar2->fccHandler)._;
            if (cVar13 == '\0') {
              cVar13 = '?';
            }
            cVar14 = (pAVar2->fccHandler).fcc[1];
            if (cVar14 == '\0') {
              cVar14 = '?';
            }
            local_380 = (ulong)(uint)(int)cVar14;
            cVar14 = (pAVar2->fccHandler).fcc[2];
            if (cVar14 == '\0') {
              cVar14 = '?';
            }
            cVar27 = (pAVar2->fccHandler).fcc[3];
            if (cVar27 == '\0') {
              cVar27 = '?';
            }
            local_388 = (ulong)(uint)(int)cVar14;
            snprintf(message,0x200,
                     "AVISTREAMHEADER (\n  fccType=%c%c%c%c,\n  fccHandler=%c%c%c%c,\n  dwFlags=%i,\n  wPriority=%i,\n  wLanguage=%i,\n  dwInitialFrames=%i\n  dwScale=%i\n  dwRate=%i\n  dwStart=%i\n  dwLength=%i\n  dwSuggestedBufferSize=%i\n  dwQuality=%i\n  dwSampleSize=%i\n  rcFrame.left=%i\n  rcFrame.top=%i\n  rcFrame.right=%i\n  rcFrame.bottom=%i\n)"
                     ,uVar26,(ulong)uVar28,(ulong)uVar8,(ulong)uVar9,(ulong)(uint)(int)cVar13,
                     local_380,local_388,(ulong)(uint)(int)cVar27,(ulong)pAVar2->dwFlags,
                     (ulong)pAVar2->wPriority,(ulong)pAVar2->wLanguage,
                     (ulong)pAVar2->dwInitialFrames,(ulong)pAVar2->dwScale,(ulong)pAVar2->dwRate,
                     (ulong)pAVar2->dwStart,(ulong)pAVar2->dwLength,
                     (ulong)pAVar2->dwSuggestedBufferSize,(ulong)pAVar2->dwQuality,
                     (ulong)pAVar2->dwSampleSize,(ulong)(uint)(int)(pAVar2->rcFrame).left,
                     (ulong)(uint)(int)(pAVar2->rcFrame).top,
                     (ulong)(uint)(int)(pAVar2->rcFrame).right,
                     (ulong)(uint)(int)(pAVar2->rcFrame).bottom);
            piVar29 = &entries.
                       super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                       ._M_impl.super__Deque_impl_data._M_start;
            entries.
            super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
            ._M_impl.super__Deque_impl_data._M_map = &piVar29->_M_cur;
            sVar19 = strlen(message);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&entries,message,message + sVar19);
            LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
            if ((iterator *)
                entries.
                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                ._M_impl.super__Deque_impl_data._M_map != piVar29) {
              operator_delete(entries.
                              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                              ._M_impl.super__Deque_impl_data._M_map,
                              (ulong)((long)&(entries.
                                              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                              ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                             qwOffset + 1));
            }
            local_378 = local_378 + 1;
          }
        }
        else if (tag._0_4_ == 0x70727076) {
          std::istream::read((char *)piVar1,(long)&size);
          std::istream::read((char *)piVar1,(long)&entries);
          pvVar22 = malloc(((ulong)entries.
                                   super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_last & 0xffffffff) <<
                           5);
          std::istream::read((char *)piVar1,(long)pvVar22);
          free(pvVar22);
        }
        else if (tag._0_4_ != 0x74616454) {
          if (tag._0_4_ != 0x78646e69) goto LAB_0012846a;
          std::istream::read((char *)piVar1,(long)&size);
          local_380 = std::istream::tellg();
          local_388 = (ulong)size;
          super_index.fcc = (FOURCC)tag._0_4_;
          super_index.cb = size;
          std::istream::read((char *)piVar1,(long)&super_index.wLongsPerEntry);
          fcc._M_dataplus._M_p = (pointer)&fcc.field_2;
          __s = &super_index.dwChunkId;
          sVar19 = strlen(__s->fcc);
          std::__cxx11::string::_M_construct<char_const*>((string *)&fcc,__s,sVar19 + (long)__s);
          std::__cxx11::string::substr((ulong)&entries,(ulong)&fcc);
          pp_Var11 = entries.
                     super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                     ._M_impl.super__Deque_impl_data._M_map;
          iVar16 = atoi((char *)entries.
                                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                ._M_impl.super__Deque_impl_data._M_map);
          if ((iterator *)pp_Var11 != piVar29) {
            operator_delete(pp_Var11,(ulong)((long)&(entries.
                                                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                                  qwOffset + 1));
          }
          stream_idx = iVar16;
          if (super_index.bIndexSubType != '\0') {
            __assert_fail("0 == super_index.bIndexSubType",
                          "/workspace/llm4binary/github/license_c_cmakelists/arionik[P]avilib/reader.cpp"
                          ,0x10a,"bool avilib::AviReader::open(const char *)");
          }
          if (super_index.bIndexType != '\0') {
            entries.
            super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
            ._M_impl.super__Deque_impl_data._M_map = &piVar29->_M_cur;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&entries,"Warning: AVI_INDEX_OF_INDEXES != super_index.bIndexType",
                       "");
            LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
            if ((iterator *)
                entries.
                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                ._M_impl.super__Deque_impl_data._M_map != piVar29) {
              operator_delete(entries.
                              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                              ._M_impl.super__Deque_impl_data._M_map,
                              (ulong)((long)&(entries.
                                              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                              ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                             qwOffset + 1));
            }
          }
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_map_size = 0;
          std::
          _Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>::
          _M_initialize_map(&entries.
                             super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                            ,0);
          if (super_index.nEntriesInUse == 0) {
            uVar26 = 0;
          }
          else {
            uVar28 = 0;
            do {
              std::istream::read((char *)piVar1,(long)&entry);
              if (entries.
                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  entries.
                  super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::
                deque<avilib::_avisuperindex_entry,std::allocator<avilib::_avisuperindex_entry>>::
                _M_push_back_aux<avilib::_avisuperindex_entry_const&>
                          ((deque<avilib::_avisuperindex_entry,std::allocator<avilib::_avisuperindex_entry>>
                            *)&entries,&entry);
              }
              else {
                (entries.
                 super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur)->qwOffset = entry.qwOffset;
                (entries.
                 super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur)->dwSize = entry.dwSize;
                (entries.
                 super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur)->dwDuration = entry.dwDuration;
                entries.
                super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     entries.
                     super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              uVar28 = uVar28 + 1;
              uVar26 = (ulong)super_index.nEntriesInUse;
            } while (uVar28 < super_index.nEntriesInUse);
          }
          snprintf(message,0x200,"%ux AVISUPERINDEX_ENTRY (%s)",uVar26,fcc._M_dataplus._M_p);
          entry.qwOffset = (uint64_t)&local_398;
          sVar19 = strlen(message);
          std::__cxx11::string::_M_construct<char_const*>((string *)&entry,message,message + sVar19)
          ;
          LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
          if ((uint *)entry.qwOffset != &local_398) {
            operator_delete((void *)entry.qwOffset,CONCAT44(uStack_394,local_398) + 1);
          }
          p_Var12 = entries.
                    super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (entries.
              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur !=
              entries.
              super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
            local_3b8 = entries.
                        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node;
            p_Var30 = entries.
                      super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur;
            p_Var31 = entries.
                      super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last;
            do {
              std::istream::seekg((long)piVar1,(_Ios_Seekdir)p_Var30->qwOffset);
              local_398 = 0;
              uStack_394 = 0;
              uStack_390 = 0;
              uStack_38c = 0;
              entry.qwOffset = 0;
              entry.dwSize = 0;
              entry.dwDuration = 0;
              std::istream::read((char *)piVar1,(long)&entry);
              if (local_398 != 0x20636572) {
                allowed._M_elems[0] = 0x63643030;
                allowed._M_elems[1] = 0x62643030;
                allowed._M_elems[2] = 0x63643130;
                allowed._M_elems[3] = 0x62643130;
                allowed._M_elems[4] = 0x62773030;
                allowed._M_elems[5] = 0x62773130;
                puVar21 = std::
                          __find_if<unsigned_int*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                    (&allowed,local_240,&local_398);
                if (puVar21 != local_240) {
                  puVar3 = &dml_index.u32_size;
                  if (entry.dwSize._3_1_ != '\x01') {
                    dml_index._0_8_ = puVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&dml_index,
                               "Warning: AVI_INDEX_OF_CHUNKS != std_index.bIndexType","");
                    LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_09,
                                                                extraout_XMM0_Da_09));
                    if ((uint32_t *)dml_index._0_8_ != puVar3) {
                      operator_delete((void *)dml_index._0_8_,
                                      CONCAT44(dml_index._20_4_,dml_index.u32_size) + 1);
                    }
                  }
                  if (entry.dwSize._2_1_ != '\0') {
                    dml_index._0_8_ = puVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&dml_index,"Warning: 0 != std_index.bIndexSubType","");
                    LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_10,
                                                                extraout_XMM0_Da_10));
                    if ((uint32_t *)dml_index._0_8_ != puVar3) {
                      operator_delete((void *)dml_index._0_8_,
                                      CONCAT44(dml_index._20_4_,dml_index.u32_size) + 1);
                    }
                  }
                  pvVar22 = operator_new__(entry.qwOffset >> 0x20);
                  std::istream::read((char *)piVar1,(long)pvVar22);
                  if (entry.dwDuration != 0) {
                    lVar32 = 0;
                    do {
                      dml_index.u32_flags = 0;
                      dml_index.dwChunkId = (FOURCC)local_398;
                      dml_index.i64_offset =
                           (ulong)*(uint *)((long)pvVar22 + lVar32 * 8) +
                           CONCAT44(uStack_390,uStack_394);
                      dml_index.u32_size = *(uint *)((long)pvVar22 + lVar32 * 8 + 4) & 0x7fffffff;
                      pdVar23 = (deque<avilib::AviReader::_dmlindex,std::allocator<avilib::AviReader::_dmlindex>>
                                 *)std::
                                   map<int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
                                   ::operator[](&this->odml_frameIdxs,&stream_idx);
                      puVar7 = *(undefined8 **)(pdVar23 + 0x30);
                      if (puVar7 == (undefined8 *)(*(long *)(pdVar23 + 0x40) + -0x18)) {
                        std::
                        deque<avilib::AviReader::_dmlindex,std::allocator<avilib::AviReader::_dmlindex>>
                        ::_M_push_back_aux<avilib::AviReader::_dmlindex_const&>(pdVar23,&dml_index);
                      }
                      else {
                        puVar7[2] = CONCAT44(dml_index._20_4_,dml_index.u32_size);
                        *puVar7 = dml_index._0_8_;
                        puVar7[1] = dml_index.i64_offset;
                        *(long *)(pdVar23 + 0x30) = *(long *)(pdVar23 + 0x30) + 0x18;
                      }
                      lVar32 = lVar32 + 1;
                    } while ((uint)lVar32 < entry.dwDuration);
                  }
                  operator_delete__(pvVar22);
                }
                std::ios::clear((int)*(undefined8 *)(*(long *)piVar1 + -0x18) + iVar15);
              }
              p_Var30 = p_Var30 + 1;
              if (p_Var30 == p_Var31) {
                p_Var30 = local_3b8[1];
                local_3b8 = local_3b8 + 1;
                p_Var31 = p_Var30 + 0x20;
              }
            } while (p_Var30 != p_Var12);
          }
          pmVar24 = std::
                    map<int,_avilib::_avisuperindex_chunk,_std::less<int>,_std::allocator<std::pair<const_int,_avilib::_avisuperindex_chunk>_>_>
                    ::operator[](&this->m_superIndex,&stream_idx);
          pmVar24->dwChunkId = super_index.dwChunkId;
          pmVar24->dwReserved[0] = super_index.dwReserved[0];
          *(undefined8 *)(pmVar24->dwReserved + 1) = super_index.dwReserved._4_8_;
          pmVar24->fcc = super_index.fcc;
          pmVar24->cb = super_index.cb;
          pmVar24->wLongsPerEntry = super_index.wLongsPerEntry;
          pmVar24->bIndexSubType = super_index.bIndexSubType;
          pmVar24->bIndexType = super_index.bIndexType;
          pmVar24->nEntriesInUse = super_index.nEntriesInUse;
          std::ios::clear((int)*(undefined8 *)(*(long *)piVar1 + -0x18) + iVar15);
          std::istream::seekg((long)piVar1,(int)local_380 + (int)local_388);
          std::
          _Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>::
          ~_Deque_base(&entries.
                        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                      );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fcc._M_dataplus._M_p != &fcc.field_2) {
            operator_delete(fcc._M_dataplus._M_p,
                            CONCAT44(fcc.field_2._M_allocated_capacity._4_4_,
                                     fcc.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
      } while (*(int *)(&this->field_0x78 + *(long *)(*(long *)&this->_f + -0x18)) == 0);
    }
    if ((this->odml_frameIdxs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::
      _Rb_tree<int,_std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
      ::swap(&(this->m_frameIdxs)._M_t,&(this->odml_frameIdxs)._M_t);
      piVar29 = &entries.
                 super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                 ._M_impl.super__Deque_impl_data._M_start;
      entries.
      super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
      ._M_impl.super__Deque_impl_data._M_map = &piVar29->_M_cur;
      std::__cxx11::string::_M_construct<char_const*>((string *)&entries,"using OpenDML index","");
      LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      if ((iterator *)
          entries.
          super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
          ._M_impl.super__Deque_impl_data._M_map != piVar29) {
        operator_delete(entries.
                        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                        ._M_impl.super__Deque_impl_data._M_map,
                        (ulong)((long)&(entries.
                                        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_cur)->qwOffset +
                               1));
      }
    }
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->_f + -0x18) + iVar15);
    std::istream::seekg((long)piVar1,_S_beg);
    puVar6 = (this->m_moviOffs).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    iVar15 = (int)CONCAT71((int7)((ulong)puVar6 >> 8),
                           puVar6 != (this->m_moviOffs).
                                     super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  else {
    piVar29 = &entries.
               super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
               ._M_impl.super__Deque_impl_data._M_start;
    entries.
    super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>.
    _M_impl.super__Deque_impl_data._M_map = &piVar29->_M_cur;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&entries,"Cannot parse, file is bad.","");
    LoggingObject::log(this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    if ((iterator *)
        entries.
        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
        ._M_impl.super__Deque_impl_data._M_map != piVar29) {
      operator_delete(entries.
                      super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                      ._M_impl.super__Deque_impl_data._M_map,
                      (ulong)((long)&(entries.
                                      super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur)->qwOffset + 1
                             ));
    }
LAB_0012785d:
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

bool avilib::AviReader::open( const char *filename )
{
	char tag[ 5 ] = {0};
	uint32_t size = 0;
	bool b_audio = false;
	int32_t i_streamHeader = 0;
	m_useMovieOffset = false;
	char message[512];
	clear_log();

	m_moviOffs.clear();
	_f.open( filename, ifstream::binary );
	if( !_f.good() ){
		log( "Cannot parse, file is bad." );
		return false;
	}

	_f.seekg(0,ifstream::beg);
	for(;_f.good();)
	{
		int64_t pos = _f.tellg();
		if( !_f.read( tag, 4 ) ) break;

		snprintf( message, 512, "%s @ " LLU, tag, (uint64_t)pos );
		log( message );

		if( *(uint32_t *)tag == (uint32_t)'KNUJ' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'FFIR' ){
			_f.read( (char *)&size, 4 );  // file size
		}
		else if( *(uint32_t *)tag == (uint32_t)' IVA' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'XIVA' ){
			continue; // OPENDML: AVIX, further RIFF chunk(s)
		}
		else if( *(uint32_t *)tag == (uint32_t)'TSIL' ){
			_f.read( (char *)&size, 4 );  // 1st: file size
		}
		else if( *(uint32_t *)tag == (uint32_t)'lrdh' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'hiva' ){
			_f.read( (char *)&size, 4 );  // AVIMAINHEADER
			if( size != sizeof( avilib::AVIMAINHEADER ) - 8 )
				return false;
			m_avimHeader.fcc = *(FOURCC*)tag;
			m_avimHeader.cb = size;
			_f.read( (char *)&m_avimHeader + 8, m_avimHeader.cb );
			snprintf( message, 512, "AVIMAINHEADER (\n  dwFlags=0x%x,\n  dwWidth=%i,\n  dwHeight=%i,\n  dwStreams=%i,\n  dwInitialFrames=%i,\n  dwMaxBytesPerSec=%i\n  dwMicroSecPerFrame=%i\n  dwPaddingGranularity=%i\n  dwSuggestedBufferSize=%i\n  dwTotalFrames=%i\n)",
					m_avimHeader.dwFlags, m_avimHeader.dwWidth, m_avimHeader.dwHeight, m_avimHeader.dwStreams, m_avimHeader.dwInitialFrames, m_avimHeader.dwMaxBytesPerSec, m_avimHeader.dwMicroSecPerFrame, m_avimHeader.dwPaddingGranularity, m_avimHeader.dwSuggestedBufferSize, m_avimHeader.dwTotalFrames );
			log( message );
		}
		else if( *(uint32_t *)tag == (uint32_t)'lrts' ){
			if( i_streamHeader >= 2 ) return false;
			_f.read( (char *)&m_avisHeader[i_streamHeader], sizeof(avilib::AVISTREAMHEADER) );
			b_audio = m_avisHeader[i_streamHeader].fccType._ == (uint32_t)'sdua';
			if( !b_audio )
				m_videoStreamIdx = i_streamHeader;

			snprintf( message, 512, "AVISTREAMHEADER (\n  fccType=%c%c%c%c,\n  fccHandler=%c%c%c%c,\n  dwFlags=%i,\n  wPriority=%i,\n  wLanguage=%i,\n  dwInitialFrames=%i\n  dwScale=%i\n  dwRate=%i\n  dwStart=%i\n  dwLength=%i\n  dwSuggestedBufferSize=%i\n  dwQuality=%i\n  dwSampleSize=%i\n  rcFrame.left=%i\n  rcFrame.top=%i\n  rcFrame.right=%i\n  rcFrame.bottom=%i\n)",
					m_avisHeader[i_streamHeader].fccType.fcc[0] ? m_avisHeader[i_streamHeader].fccType.fcc[0] : '?',
					m_avisHeader[i_streamHeader].fccType.fcc[1] ? m_avisHeader[i_streamHeader].fccType.fcc[1] : '?',
					m_avisHeader[i_streamHeader].fccType.fcc[2] ? m_avisHeader[i_streamHeader].fccType.fcc[2] : '?',
					m_avisHeader[i_streamHeader].fccType.fcc[3] ? m_avisHeader[i_streamHeader].fccType.fcc[3] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[0] ? m_avisHeader[i_streamHeader].fccHandler.fcc[0] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[1] ? m_avisHeader[i_streamHeader].fccHandler.fcc[1] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[2] ? m_avisHeader[i_streamHeader].fccHandler.fcc[2] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[3] ? m_avisHeader[i_streamHeader].fccHandler.fcc[3] : '?',
					m_avisHeader[i_streamHeader].dwFlags,
					m_avisHeader[i_streamHeader].wPriority,
					m_avisHeader[i_streamHeader].wLanguage,
					m_avisHeader[i_streamHeader].dwInitialFrames,
					m_avisHeader[i_streamHeader].dwScale,
					m_avisHeader[i_streamHeader].dwRate,
					m_avisHeader[i_streamHeader].dwStart,
					m_avisHeader[i_streamHeader].dwLength,
					m_avisHeader[i_streamHeader].dwSuggestedBufferSize,
					m_avisHeader[i_streamHeader].dwQuality,
					m_avisHeader[i_streamHeader].dwSampleSize,
					m_avisHeader[i_streamHeader].rcFrame.left,
					m_avisHeader[i_streamHeader].rcFrame.top,
					m_avisHeader[i_streamHeader].rcFrame.right,
					m_avisHeader[i_streamHeader].rcFrame.bottom
					);
			log( message );
			i_streamHeader++;
		}
		else if( *(uint32_t *)tag == (uint32_t)'hrts' ){
			// int z=0;
		}
		else if( *(uint32_t *)tag == (uint32_t)'frts' ){
			_f.read( (char *)&size, 4 );
			if( b_audio ){
				_f.read( (char *)&m_waveformat, std::min( size, (uint32_t)sizeof(avilib::WAVEFORMATEX) ) );
				if( m_waveformat.wFormatTag == WAVE_FORMAT_EXTENSIBLE ){
					_f.seekg(-(std::streamoff)sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					_f.read( (char *)&m_waveformatExt, (uint32_t)sizeof(avilib::WAVEFORMATEXTENSIBLE) );
					_f.seekg(size-sizeof(avilib::WAVEFORMATEXTENSIBLE),ifstream::cur);
					snprintf( message, 512, "WAVEFORMATEXTENSIBLE (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  SubFormat=...,\n  wSamplesPerBlock=%i,\n  dwChannelMask=%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign,
							m_waveformatExt.Samples.wSamplesPerBlock, m_waveformatExt.dwChannelMask);
				} else if( m_waveformat.wFormatTag == WAVE_FORMAT_MPEG ){
					_f.seekg(-(std::streamoff)sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					_f.read( (char *)&m_waveformatMpeg12, (uint32_t)sizeof(avilib::MPEG1WAVEFORMAT) );
					_f.seekg((std::streamoff)size-sizeof(avilib::MPEG1WAVEFORMAT),ifstream::cur);
					snprintf( message, 512, "MPEG1WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  dwHeadBitrate=%i,\n  dwPTSHigh=%i,\n  dwPTSLow=%i,\n  fwHeadFlags=%i,\n  fwHeadLayer=%i,\n  fwHeadMode=%i,\n  fwHeadModeExt=%i,\n  wHeadEmphasis%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign,
							m_waveformatMpeg12.dwHeadBitrate, m_waveformatMpeg12.dwPTSHigh, m_waveformatMpeg12.dwPTSLow,
							m_waveformatMpeg12.fwHeadFlags, m_waveformatMpeg12.fwHeadLayer, m_waveformatMpeg12.fwHeadMode,
							m_waveformatMpeg12.fwHeadModeExt, m_waveformatMpeg12.wHeadEmphasis );
				} else if( m_waveformat.wFormatTag == WAVE_FORMAT_MPEGLAYER3 ){
					_f.seekg(-(std::streamoff)sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					_f.read( (char *)&m_waveformatMP3, (uint32_t)sizeof(avilib::MPEGLAYER3WAVEFORMAT) );
					_f.seekg(size-sizeof(avilib::MPEGLAYER3WAVEFORMAT),ifstream::cur);
					snprintf( message, 512, "MPEGLAYER3WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n  fdwFlags%i,\n  nBlockSize%i,\n  nCodecDelay%i,\n  nFramesPerBlock%i,\n  wID=%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign,
							m_waveformatMP3.fdwFlags, m_waveformatMP3.nBlockSize, m_waveformatMP3.nCodecDelay, m_waveformatMP3.nFramesPerBlock,
							m_waveformatMP3.wID);
				} else {
					_f.seekg(size-sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					snprintf( message, 512, "WAVEFORMATEX (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign );
				}
				log( message );
			} else {
				_f.read( (char *)&m_bitmapInfo, std::min( size, (uint32_t)sizeof(avilib::BITMAPINFO) ) );
				if( size>sizeof(avilib::BITMAPINFO) )
					_f.seekg(size-sizeof(avilib::BITMAPINFO),ifstream::cur);
				snprintf( message, 512, "BITMAPINFO (\n  biWidth=%i,\n  biHeight=%i,\n  biPlanes=%i,\n  biBitCount=%i,\n  biCompression=%s,\n  biSizeImage=%i,\n  biXPelsPerMeter=%i,\n  biYPelsPerMeter=%i,\n  biClrUsed=%i,\n  biClrImportant=%i,\n)",
						m_bitmapInfo.biWidth, m_bitmapInfo.biHeight, m_bitmapInfo.biPlanes,
						m_bitmapInfo.biBitCount, m_bitmapInfo.biCompression.fcc, m_bitmapInfo.biSizeImage,
						m_bitmapInfo.biXPelsPerMeter, m_bitmapInfo.biYPelsPerMeter,
						m_bitmapInfo.biClrUsed, m_bitmapInfo.biClrImportant);
				log( message );
			}
		}
		else if( *(uint32_t *)tag == (uint32_t)'OFNI' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'TFSI' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'nrts' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size-4,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'ivom' ){
			// the movie list, here is the data.
			m_moviOffs.push_back((size_t)_f.tellg() - 4);
			_f.seekg(size-4, ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'1xdi' ){
			_f.read( (char *)&size, 4 );
			uint8_t *p = new uint8_t[size], *p0 = p;
			size = (uint32_t)_f.read((char *)p,size).gcount();
			for (size_t i=0; i<size/sizeof(AVIOLDINDEX); i++) {
				AVIOLDINDEX *idx = (AVIOLDINDEX *)p;
				p += sizeof(AVIOLDINDEX);
				
				if( idx->dwChunkId._ == ' cer' )
					continue;

				DMLINDEX dml_index;
				dml_index.dwChunkId = idx->dwChunkId;
				dml_index.u32_flags = idx->dwFlags;
				dml_index.i64_offset = idx->dwOffset;
				dml_index.u32_size = idx->dwSize;
				string fcc = idx->dwChunkId.fcc;
				int32_t stream_idx = atoi(fcc.substr(0,2).c_str());
				m_frameIdxs[stream_idx].push_back(dml_index);
/*
				switch(m_videoStreamIdx){
				case 0:
					if( idx->dwChunkId._ == (uint32_t)'cd00' || idx->dwChunkId._ == (uint32_t)'bd00' )//'bw10' )
						m_frameIdxs[stream_idx].push_back(dml_index);
					break;
				case 1:
					if( idx->dwChunkId._ == (uint32_t)'cd10' || idx->dwChunkId._ == (uint32_t)'bd10' )//'bw10' )
						m_frameIdxs[stream_idx].push_back(dml_index);
					break;
				}
 */
			}
			snprintf( message, 512, "%x AVIOLDINDEX", size/( uint32_t )sizeof(AVIOLDINDEX));
			log( message );
			delete [] p0;
		}
		else if( *(uint32_t *)tag == (uint32_t)'lmdo' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'hlmd' ){
			_f.read( (char *)&size, 4 );
			_f.read((char *)&m_odmlExt, sizeof(avilib::ODMLExtendedAVIHeader));
			_f.seekg(size - sizeof(avilib::ODMLExtendedAVIHeader),ifstream::cur);
			snprintf( message, 512, "ODMLExtendedAVIHeader ( dwTotalFrames=%i )", m_odmlExt.dwTotalFrames); log( message );
		}
		else if( *(uint32_t *)tag == (uint32_t)'lhmd' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'xdni' ){
			_f.read( (char *)&size, 4 );  // AVISUPERINDEX
			streampos superindex_end = _f.tellg() + (streampos)size;

			avilib::AVISUPERINDEX super_index;
			super_index.fcc._ = *((uint32_t *)&tag);
			super_index.cb = size;
			_f.read( (char *)&super_index + 8, sizeof(avilib::AVISUPERINDEX)-8 );

			string fcc = super_index.dwChunkId.fcc;
			int32_t stream_idx = atoi(fcc.substr(0,2).c_str());

			assert( 0 == super_index.bIndexSubType );
			if( 0 != super_index.bIndexSubType ) log( "Warning: 0 != super_index.bIndexSubType" );
			if( AVI_INDEX_OF_INDEXES != super_index.bIndexType ) log( "Warning: AVI_INDEX_OF_INDEXES != super_index.bIndexType" );
			deque<avilib::AVISUPERINDEX_ENTRY> entries;

			for( uint32_t i=0; i<super_index.nEntriesInUse; i++ )
			{
				avilib::AVISUPERINDEX_ENTRY entry;
				_f.read( (char *)&entry, sizeof(avilib::AVISUPERINDEX_ENTRY) );
				entries.push_back(entry);
			}

			snprintf( message, 512, "%ux AVISUPERINDEX_ENTRY (%s)", super_index.nEntriesInUse, fcc.c_str()); log( message );

			for( avilib::AVISUPERINDEX_ENTRY &entry : entries ){
				_f.seekg( entry.qwOffset, ifstream::beg );
				avilib::AVISTDINDEX std_index;
				memset( &std_index, 0x0, sizeof(avilib::AVISTDINDEX));
				_f.read( (char *)&std_index, sizeof(avilib::AVISTDINDEX) );

				if( std_index.dwChunkId._ == ' cer' )
					continue;

				std::array<uint32_t,6> allowed = {
					(uint32_t)'cd00', (uint32_t)'bd00', (uint32_t)'cd10', (uint32_t)'bd10',
					(uint32_t)'bw00', (uint32_t)'bw10' };

				if( std::find( allowed.begin(),allowed.end(), std_index.dwChunkId._ ) != allowed.end() ){

					// not for audio:
					if( AVI_INDEX_OF_CHUNKS != std_index.bIndexType ) log( "Warning: AVI_INDEX_OF_CHUNKS != std_index.bIndexType" );
					if( 0 != std_index.bIndexSubType ) log( "Warning: 0 != std_index.bIndexSubType" );

					//if( std_index.fcc._ == (uint32_t)'00xi' )
					{
						uint8_t *p = new uint8_t[std_index.cb], *p0 = p;
						_f.read( (char *)p, std_index.cb );
						for( uint32_t j=0; j<std_index.nEntriesInUse; j++ )
						{
							avilib::AVISTDINDEX_ENTRY *idx = (avilib::AVISTDINDEX_ENTRY *)p;
							p += sizeof(avilib::AVISTDINDEX_ENTRY);
						
							DMLINDEX dml_index;
							dml_index.dwChunkId = std_index.dwChunkId;
							dml_index.u32_flags = 0;
							dml_index.i64_offset = std_index.qwBaseOffset + idx->dwOffset;// + 4;
							dml_index.u32_size = idx->dwSize & 0x7FFFFFFF;
							if(dml_index.u32_size > m_bitmapInfo.biSizeImage){
								// int z=0;
							}

							odml_frameIdxs[stream_idx].push_back(dml_index);
						}
						delete [] p0;
					}
				}
				_f.clear();
			} // each superindex entry
			m_superIndex[stream_idx] = super_index;
			_f.clear();
			_f.seekg(superindex_end,ifstream::beg);
		}
		else if( *(uint32_t *)tag == (uint32_t)'prpv' ){
			// this does nothing and has never been tested.
			_f.read( (char *)&size, 4 );
			VIDEO_PROP_HEADER vprop_header;
			_f.read( (char *)&vprop_header, std::min((size_t)size,sizeof(VIDEO_PROP_HEADER)) );
			VIDEO_PROP_HEADER::VIDEO_FIELD_DESC *p_field_desc = (VIDEO_PROP_HEADER::VIDEO_FIELD_DESC *)malloc(sizeof(VIDEO_PROP_HEADER::VIDEO_FIELD_DESC)*vprop_header.nbFieldPerFrame);
			_f.read((char *)p_field_desc, vprop_header.nbFieldPerFrame*sizeof(VIDEO_PROP_HEADER::VIDEO_FIELD_DESC));
			free( p_field_desc );
		}
		else if( *(uint32_t *)tag == ( uint32_t )'tadT'/* Adobe Premiere Timecode */ ){
			continue;
		}
		else
		{
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
			// FIXME: check size is smaller than current parent element's size
		}
	}

	if( !odml_frameIdxs.empty() ){
		m_frameIdxs.swap(odml_frameIdxs);
		log( "using OpenDML index" );
	}

	_f.clear();
	_f.seekg(0,ifstream::beg);

	if( m_moviOffs.empty() )
		return false;
	
	return true;
}